

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

int Cudd_bddPrintCover(DdManager *dd,DdNode *l,DdNode *u)

{
  int *piVar1;
  int iVar2;
  int *array;
  DdNode *pDVar3;
  DdNode *pDVar4;
  long lVar5;
  int length;
  int local_34;
  
  iVar2 = Cudd_ReadSize(dd);
  array = (int *)malloc((long)iVar2 << 2);
  if (array == (int *)0x0) {
LAB_00801c7d:
    iVar2 = 0;
  }
  else {
    piVar1 = (int *)(((ulong)l & 0xfffffffffffffffe) + 4);
    *piVar1 = *piVar1 + 1;
    pDVar3 = Cudd_ReadLogicZero(dd);
    pDVar4 = l;
    if (pDVar3 != l) {
      do {
        pDVar4 = Cudd_LargestCube(dd,l,&local_34);
        if (pDVar4 == (DdNode *)0x0) {
LAB_00801c70:
          Cudd_RecursiveDeref(dd,l);
          free(array);
          goto LAB_00801c7d;
        }
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        pDVar3 = Cudd_bddMakePrime(dd,pDVar4,u);
        if (pDVar3 == (DdNode *)0x0) {
          Cudd_RecursiveDeref(dd,l);
          l = pDVar4;
          goto LAB_00801c70;
        }
        piVar1 = (int *)(((ulong)pDVar3 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,pDVar4);
        pDVar4 = Cudd_bddAnd(dd,l,(DdNode *)((ulong)pDVar3 ^ 1));
        if (pDVar4 == (DdNode *)0x0) {
LAB_00801c65:
          Cudd_RecursiveDeref(dd,l);
          l = pDVar3;
          goto LAB_00801c70;
        }
        piVar1 = (int *)(((ulong)pDVar4 & 0xfffffffffffffffe) + 4);
        *piVar1 = *piVar1 + 1;
        Cudd_RecursiveDeref(dd,l);
        iVar2 = Cudd_BddToCubeArray(dd,pDVar3,array);
        l = pDVar4;
        if (iVar2 == 0) goto LAB_00801c65;
        if (0 < dd->size) {
          lVar5 = 0;
          do {
            iVar2 = 0x3f;
            if ((ulong)(uint)array[lVar5] < 3) {
              iVar2 = *(int *)(&DAT_00a4a914 + (ulong)(uint)array[lVar5] * 4);
            }
            fputc(iVar2,(FILE *)dd->out);
            lVar5 = lVar5 + 1;
          } while (lVar5 < dd->size);
        }
        fwrite(" 1\n",3,1,(FILE *)dd->out);
        Cudd_RecursiveDeref(dd,pDVar3);
        pDVar3 = Cudd_ReadLogicZero(dd);
      } while (pDVar4 != pDVar3);
    }
    fputc(10,(FILE *)dd->out);
    Cudd_RecursiveDeref(dd,pDVar4);
    free(array);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

int
Cudd_bddPrintCover(
  DdManager *dd,
  DdNode *l,
  DdNode *u)
{
    int *array;
    int q, result;
    DdNode *lb;
#ifdef DD_DEBUG
    DdNode *cover;
#endif

    array = ABC_ALLOC(int, Cudd_ReadSize(dd));
    if (array == NULL) return(0);
    lb = l;
    cuddRef(lb);
#ifdef DD_DEBUG
    cover = Cudd_ReadLogicZero(dd);
    cuddRef(cover);
#endif
    while (lb != Cudd_ReadLogicZero(dd)) {
        DdNode *implicant, *prime, *tmp;
        int length;
        implicant = Cudd_LargestCube(dd,lb,&length);
        if (implicant == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(implicant);
        prime = Cudd_bddMakePrime(dd,implicant,u);
        if (prime == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,implicant);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(prime);
        Cudd_RecursiveDeref(dd,implicant);
        tmp = Cudd_bddAnd(dd,lb,Cudd_Not(prime));
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,lb);
        lb = tmp;
        result = Cudd_BddToCubeArray(dd,prime,array);
        if (result == 0) {
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        for (q = 0; q < dd->size; q++) {
            switch (array[q]) {
            case 0:
                (void) fprintf(dd->out, "0");
                break;
            case 1:
                (void) fprintf(dd->out, "1");
                break;
            case 2:
                (void) fprintf(dd->out, "-");
                break;
            default:
                (void) fprintf(dd->out, "?");
            }
        }
        (void) fprintf(dd->out, " 1\n");
#ifdef DD_DEBUG
        tmp = Cudd_bddOr(dd,prime,cover);
        if (tmp == NULL) {
            Cudd_RecursiveDeref(dd,cover);
            Cudd_RecursiveDeref(dd,lb);
            Cudd_RecursiveDeref(dd,prime);
            ABC_FREE(array);
            return(0);
        }
        cuddRef(tmp);
        Cudd_RecursiveDeref(dd,cover);
        cover = tmp;
#endif
        Cudd_RecursiveDeref(dd,prime);
    }
    (void) fprintf(dd->out, "\n");
    Cudd_RecursiveDeref(dd,lb);
    ABC_FREE(array);
#ifdef DD_DEBUG
    if (!Cudd_bddLeq(dd,cover,u) || !Cudd_bddLeq(dd,l,cover)) {
        Cudd_RecursiveDeref(dd,cover);
        return(0);
    }
    Cudd_RecursiveDeref(dd,cover);
#endif
    return(1);

}